

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContext.cpp
# Opt level: O0

void __thiscall
sglr::Context::texImage2D
          (Context *this,deUint32 target,int level,deUint32 internalFormat,int width,int height)

{
  TextureFormat texFormat;
  TransferFormat TVar1;
  deUint32 local_3c;
  deUint32 dStack_38;
  TransferFormat transferFmt;
  deUint32 dataType;
  deUint32 format;
  int height_local;
  int width_local;
  deUint32 internalFormat_local;
  int level_local;
  deUint32 target_local;
  Context *this_local;
  
  if (internalFormat - 0x1906 < 5) {
    transferFmt.format = 0x1401;
    transferFmt.dataType = internalFormat;
  }
  else {
    texFormat = glu::mapGLInternalFormat(internalFormat);
    TVar1 = glu::getTransferFormat(texFormat);
    local_3c = TVar1.format;
    transferFmt.dataType = local_3c;
    dStack_38 = TVar1.dataType;
    transferFmt.format = dStack_38;
  }
  (*this->_vptr_Context[0x11])
            (this,(ulong)target,(ulong)(uint)level,(ulong)internalFormat,(ulong)(uint)width,
             (ulong)(uint)height,0,transferFmt.dataType,transferFmt.format,0);
  return;
}

Assistant:

void Context::texImage2D (deUint32 target, int level, deUint32 internalFormat, int width, int height)
{
	deUint32	format		= GL_NONE;
	deUint32	dataType	= GL_NONE;

	switch (internalFormat)
	{
		case GL_ALPHA:
		case GL_LUMINANCE:
		case GL_LUMINANCE_ALPHA:
		case GL_RGB:
		case GL_RGBA:
			format		= internalFormat;
			dataType	= GL_UNSIGNED_BYTE;
			break;

		default:
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(glu::mapGLInternalFormat(internalFormat));
			format		= transferFmt.format;
			dataType	= transferFmt.dataType;
			break;
		}
	}

	texImage2D(target, level, internalFormat, width, height, 0, format, dataType, DE_NULL);
}